

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O1

void __thiscall
duckdb::ColumnReader::PlainSkipTemplated<duckdb::TemplatedParquetValueConversion<double>>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values)

{
  ulong uVar1;
  ulong req_len;
  
  if ((defines != (uint8_t *)0x0) && (this->column_schema->max_define != 0)) {
    PlainSkipTemplatedDefines<duckdb::TemplatedParquetValueConversion<double>,true>
              (this,plain_data,defines,num_values);
    return;
  }
  req_len = num_values * 8;
  uVar1 = plain_data->len;
  if (uVar1 < req_len) {
    ByteBuffer::available(plain_data,req_len);
    uVar1 = plain_data->len;
  }
  plain_data->len = uVar1 + num_values * -8;
  plain_data->ptr = plain_data->ptr + req_len;
  return;
}

Assistant:

void PlainSkipTemplated(ByteBuffer &plain_data, const uint8_t *defines, uint64_t num_values) {
		if (HasDefines() && defines) {
			PlainSkipTemplatedDefines<CONVERSION, true>(plain_data, defines, num_values);
		} else {
			PlainSkipTemplatedDefines<CONVERSION, false>(plain_data, defines, num_values);
		}
	}